

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O3

Uint32 __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::GetGeometryDescIndex
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name)

{
  Uint32 UVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  char *in_R8;
  string msg;
  undefined1 local_49;
  string local_48;
  char *local_28;
  
  local_28 = Name;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[32]>(&local_48,(char (*) [32])"Geometry name must not be empty");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"GetGeometryDescIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0x8b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_48,Name,false);
  p_Var2 = std::
           _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_NameToIndex)._M_h,
                      (local_48._M_string_length & 0x7fffffffffffffff) %
                      (this->m_NameToIndex)._M_h._M_bucket_count,(key_type *)&local_48,
                      local_48._M_string_length & 0x7fffffffffffffff);
  if (p_Var2 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var2->_M_nxt;
  }
  if ((local_48._M_dataplus._M_p != (Char *)0x0) && ((long)local_48._M_string_length < 0)) {
    operator_delete__(local_48._M_dataplus._M_p);
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    local_49 = 0x27;
    FormatString<char[32],char_const*,char>
              (&local_48,(Diligent *)"Can\'t find geometry with name \'",(char (*) [32])&local_28,
               (char **)&local_49,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    UVar1 = 0xffffffff;
  }
  else {
    UVar1 = *(Uint32 *)&p_Var3[3]._M_nxt;
  }
  return UVar1;
}

Assistant:

GetGeometryDescIndex(const char* Name) const override final
    {
        DEV_CHECK_ERR(Name != nullptr && Name[0] != '\0', "Geometry name must not be empty");

        auto iter = m_NameToIndex.find(Name);
        if (iter != m_NameToIndex.end())
            return iter->second.IndexInDesc;

        LOG_ERROR_MESSAGE("Can't find geometry with name '", Name, '\'');
        return INVALID_INDEX;
    }